

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

QStringList * QProcess::systemEnvironment(void)

{
  long lVar1;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringList *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QProcessEnvironment::systemEnvironment();
  QProcessEnvironment::toStringList((QProcessEnvironment *)this);
  QProcessEnvironment::~QProcessEnvironment((QProcessEnvironment *)0x792fd2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QProcess::systemEnvironment()
{
    return QProcessEnvironment::systemEnvironment().toStringList();
}